

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
initContents(PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
             *this)

{
  Entry *pEVar1;
  Entry *pEVar2;
  ulong uVar3;
  
  this->_numEntries = 0x10;
  this->_size = 0;
  uVar3 = (ulong)this->_numEntries;
  pEVar1 = (Entry *)operator_new__(uVar3 * 0x10);
  if (uVar3 != 0) {
    pEVar2 = pEVar1;
    do {
      (pEVar2->key)._val = -1;
      pEVar2->value = (FaceData *)0x0;
      pEVar2 = pEVar2 + 1;
    } while (pEVar2 != pEVar1 + uVar3);
  }
  this->_entries = pEVar1;
  return;
}

Assistant:

void initContents()
    {
        _numEntries = 16;
        _size = 0;
        _entries = new Entry[_numEntries];
    }